

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

int secp256k1_dleq_prove
              (secp256k1_context *ctx,secp256k1_scalar *s,secp256k1_scalar *e,secp256k1_scalar *sk,
              secp256k1_ge *gen2,secp256k1_ge *p1,secp256k1_ge *p2,
              secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp,void *ndata)

{
  int iVar1;
  uint uVar2;
  size_t local_1d8;
  size_t pubkey_size;
  uchar local_1c8 [4];
  int ret;
  uchar p2_33 [33];
  uchar local_198 [8];
  uchar p1_33 [33];
  uchar local_168 [8];
  uchar gen2_33 [33];
  uchar local_138 [8];
  uchar sk32 [32];
  undefined1 local_110 [8];
  secp256k1_scalar k;
  secp256k1_ge r2;
  secp256k1_ge r1;
  secp256k1_ge *p1_local;
  secp256k1_ge *gen2_local;
  secp256k1_scalar *sk_local;
  secp256k1_scalar *e_local;
  secp256k1_scalar *s_local;
  secp256k1_context *ctx_local;
  
  memset(local_110,0,0x20);
  pubkey_size._4_4_ = 1;
  local_1d8 = 0x21;
  secp256k1_scalar_get_b32(local_138,sk);
  iVar1 = secp256k1_eckey_pubkey_serialize(gen2,local_168,&local_1d8,1);
  if (iVar1 == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_eckey_pubkey_serialize(p1,local_198,&local_1d8,1);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_eckey_pubkey_serialize(p2,local_1c8,&local_1d8,1);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        uVar2 = secp256k1_dleq_nonce
                          ((secp256k1_scalar *)local_110,local_138,local_168,local_198,local_1c8,
                           noncefp,ndata);
        pubkey_size._4_4_ = uVar2 & pubkey_size._4_4_;
        secp256k1_dleq_pair(&ctx->ecmult_gen_ctx,(secp256k1_ge *)&r2.infinity,
                            (secp256k1_ge *)(k.d + 3),(secp256k1_scalar *)local_110,gen2);
        secp256k1_declassify(ctx,&r2.infinity,0x58);
        secp256k1_declassify(ctx,k.d + 3,0x58);
        secp256k1_dleq_challenge
                  (e,gen2,(secp256k1_ge *)&r2.infinity,(secp256k1_ge *)(k.d + 3),p1,p2);
        secp256k1_scalar_mul(s,e,sk);
        secp256k1_scalar_add(s,s,(secp256k1_scalar *)local_110);
        secp256k1_scalar_clear((secp256k1_scalar *)local_110);
        ctx_local._4_4_ = pubkey_size._4_4_;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int secp256k1_dleq_prove(const secp256k1_context* ctx, secp256k1_scalar *s, secp256k1_scalar *e, const secp256k1_scalar *sk, secp256k1_ge *gen2, secp256k1_ge *p1, secp256k1_ge *p2, secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp, void *ndata) {
    secp256k1_ge r1, r2;
    secp256k1_scalar k = { 0 };
    unsigned char sk32[32];
    unsigned char gen2_33[33];
    unsigned char p1_33[33];
    unsigned char p2_33[33];
    int ret = 1;
    size_t pubkey_size = 33;

    secp256k1_scalar_get_b32(sk32, sk);
    if (!secp256k1_eckey_pubkey_serialize(gen2, gen2_33, &pubkey_size, 1)) {
        return 0;
    }
    if (!secp256k1_eckey_pubkey_serialize(p1, p1_33, &pubkey_size, 1)) {
        return 0;
    }
    if (!secp256k1_eckey_pubkey_serialize(p2, p2_33, &pubkey_size, 1)) {
        return 0;
    }

    ret &= secp256k1_dleq_nonce(&k, sk32, gen2_33, p1_33, p2_33, noncefp, ndata);
    /* R1 = k*G, R2 = k*Y */
    secp256k1_dleq_pair(&ctx->ecmult_gen_ctx, &r1, &r2, &k, gen2);
    /* We declassify the non-secret values r1 and r2 to allow using them as
     * branch points. */
    secp256k1_declassify(ctx, &r1, sizeof(r1));
    secp256k1_declassify(ctx, &r2, sizeof(r2));

    /* e = tagged hash(p1, gen2, p2, r1, r2) */
    /* s = k + e * sk */
    secp256k1_dleq_challenge(e, gen2, &r1, &r2, p1, p2);
    secp256k1_scalar_mul(s, e, sk);
    secp256k1_scalar_add(s, s, &k);

    secp256k1_scalar_clear(&k);
    return ret;
}